

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_frame_size(AV1_COMMON *cm,int frame_size_override,aom_write_bit_buffer *wb)

{
  int in_ESI;
  long in_RDI;
  int num_bits_height;
  int num_bits_width;
  SequenceHeader *seq_params;
  int coded_height;
  int coded_width;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  if (in_ESI != 0) {
    in_stack_ffffffffffffffd4 = **(undefined4 **)(in_RDI + 0x6088);
    in_stack_ffffffffffffffd0 = (*(undefined4 **)(in_RDI + 0x6088))[1];
    aom_wb_write_literal
              ((aom_write_bit_buffer *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
               ,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    aom_wb_write_literal
              ((aom_write_bit_buffer *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
               ,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  }
  write_superres_scale
            ((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (aom_write_bit_buffer *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  write_render_size((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                    (aom_write_bit_buffer *)
                    CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  return;
}

Assistant:

static inline void write_frame_size(const AV1_COMMON *cm,
                                    int frame_size_override,
                                    struct aom_write_bit_buffer *wb) {
  const int coded_width = cm->superres_upscaled_width - 1;
  const int coded_height = cm->superres_upscaled_height - 1;

  if (frame_size_override) {
    const SequenceHeader *seq_params = cm->seq_params;
    int num_bits_width = seq_params->num_bits_width;
    int num_bits_height = seq_params->num_bits_height;
    aom_wb_write_literal(wb, coded_width, num_bits_width);
    aom_wb_write_literal(wb, coded_height, num_bits_height);
  }

  write_superres_scale(cm, wb);
  write_render_size(cm, wb);
}